

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

UINT32 __thiscall VGMPlayer::Render(VGMPlayer *this,UINT32 smplCnt,WAVE_32BS *data)

{
  pointer pDVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  UINT32 UVar5;
  ulong uVar6;
  pointer pCVar7;
  long lVar8;
  ulong uVar9;
  
  UVar5 = this->_playSmpl;
  uVar6 = 0;
  while( true ) {
    iVar2 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x16])(this,(ulong)UVar5);
    ParseFile(this,iVar2 - this->_playTick);
    iVar2 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this,(ulong)this->_fileTick);
    uVar3 = iVar2 - this->_playSmpl;
    if (((int)uVar3 < 1) ||
       ((this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      uVar3 = 1;
    }
    UVar5 = smplCnt - (int)uVar6;
    if (uVar3 < UVar5) {
      UVar5 = uVar3;
    }
    for (uVar4 = 0;
        pCVar7 = (this->_devices).
                 super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)(((long)(this->_devices).
                               super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7) / 0xf0);
        uVar4 = uVar4 + 1) {
      if (pCVar7[uVar4].optID == 0xffffffffffffffff) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)this->_devOpts[pCVar7[uVar4].optID].muteOpts.disable;
      }
      for (pCVar7 = pCVar7 + uVar4; pCVar7 != (pointer)0x0; pCVar7 = (pointer)(pCVar7->base).linkDev
          ) {
        if (((pCVar7->base).defInf.dataPtr != (DEV_DATA *)0x0) && ((uVar9 & 1) == 0)) {
          Resmpl_Execute(&(pCVar7->base).resmpl,UVar5,data + uVar6);
        }
        uVar9 = uVar9 >> 1;
      }
    }
    lVar8 = 0x10;
    for (uVar4 = 0;
        pDVar1 = (this->_dacStreams).
                 super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)(((long)(this->_dacStreams).
                               super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x38);
        uVar4 = uVar4 + 1) {
      (**(code **)(*(long *)((long)&(pDVar1->defInf).dataPtr + lVar8) + 0x30))
                (*(undefined8 *)((long)pDVar1 + lVar8 + -0x10),UVar5,0);
      lVar8 = lVar8 + 0x38;
    }
    uVar3 = (int)uVar6 + UVar5;
    uVar6 = (ulong)uVar3;
    UVar5 = UVar5 + this->_playSmpl;
    this->_playSmpl = UVar5;
    if ((this->_psTrigger & 2) != 0) break;
    if (smplCnt <= uVar3) {
      return uVar3;
    }
  }
  this->_psTrigger = this->_psTrigger & 0xfd;
  return uVar3;
}

Assistant:

UINT32 VGMPlayer::Render(UINT32 smplCnt, WAVE_32BS* data)
{
	UINT32 curSmpl;
	UINT32 smplFileTick;
	UINT32 maxSmpl;
	INT32 smplStep;	// might be negative due to rounding errors in Tick2Sample
	size_t curDev;
	
	// Note: use do {} while(), so that "smplCnt == 0" can be used to process until reaching the next sample.
	curSmpl = 0;
	do
	{
		smplFileTick = Sample2Tick(_playSmpl);
		ParseFile(smplFileTick - _playTick);
		
		// render as many samples at once as possible (for better performance)
		maxSmpl = Tick2Sample(_fileTick);
		smplStep = maxSmpl - _playSmpl;
		// When DAC streams are active, limit step size to 1, so that DAC streams and sound chip emulation are in sync.
		if (smplStep < 1 || ! _dacStreams.empty())
			smplStep = 1;	// must render at least 1 sample in order to advance
		if ((UINT32)smplStep > smplCnt - curSmpl)
			smplStep = smplCnt - curSmpl;
		
		for (curDev = 0; curDev < _devices.size(); curDev ++)
		{
			CHIP_DEVICE* cDev = &_devices[curDev];
			UINT8 disable = (cDev->optID != (size_t)-1) ? _devOpts[cDev->optID].muteOpts.disable : 0x00;
			VGM_BASEDEV* clDev;
			
			for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev, disable >>= 1)
			{
				if (clDev->defInf.dataPtr != NULL && ! (disable & 0x01))
					Resmpl_Execute(&clDev->resmpl, smplStep, &data[curSmpl]);
			}
		}
		for (curDev = 0; curDev < _dacStreams.size(); curDev ++)
		{
			DEV_INFO* dacDInf = &_dacStreams[curDev].defInf;
			dacDInf->devDef->Update(dacDInf->dataPtr, smplStep, NULL);
		}
		
		curSmpl += smplStep;
		_playSmpl += smplStep;
		if (_psTrigger & PLAYSTATE_END)
		{
			_psTrigger &= ~PLAYSTATE_END;
			break;
		}
	} while(curSmpl < smplCnt);
	
	return curSmpl;
}